

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O2

uint __thiscall embree::SubdivMesh::getNextHalfEdge(SubdivMesh *this,uint edgeID)

{
  undefined8 *puVar1;
  allocator local_39;
  string local_38 [32];
  
  if ((ulong)edgeID < this->numHalfEdges) {
    return edgeID + (((this->topology).items)->halfEdges).items[edgeID].next_half_edge_ofs;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string(local_38,"invalid half edge",&local_39);
  *puVar1 = &PTR__rtcore_error_021d38e0;
  *(undefined4 *)(puVar1 + 1) = 2;
  std::__cxx11::string::string((string *)(puVar1 + 2),local_38);
  __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

unsigned int SubdivMesh::getNextHalfEdge(unsigned int edgeID)
  {
    if (edgeID >= numHalfEdges)
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid half edge");

    return edgeID + topology[0].halfEdges[edgeID].next_half_edge_ofs;
  }